

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioRead.c
# Opt level: O2

Mio_Library_t * Mio_LibraryRead(char *FileName,char *pBuffer,char *ExcludeFile,int fVerbose)

{
  uint uVar1;
  st__table *tExcludeGate;
  char *pBuffer_00;
  Mio_Library_t *pMVar2;
  char *pcVar3;
  int fVerbose_00;
  
  if (ExcludeFile == (char *)0x0) {
    tExcludeGate = (st__table *)0x0;
    fVerbose_00 = fVerbose;
  }
  else {
    tExcludeGate = st__init_table(strcmp,st__strhash);
    uVar1 = Mio_LibraryReadExclude(ExcludeFile,tExcludeGate);
    if (uVar1 == 0xffffffff) {
      st__free_table(tExcludeGate);
      return (Mio_Library_t *)0x0;
    }
    fVerbose_00 = 0xde3020;
    fprintf(_stdout,"Read %d gates from exclude file\n",(ulong)uVar1);
  }
  pBuffer_00 = Abc_UtilStrsav(pBuffer);
  if (pBuffer == (char *)0x0) {
    pMVar2 = Mio_LibraryReadOne(FileName,0,tExcludeGate,fVerbose);
    if (pMVar2 != (Mio_Library_t *)0x0) goto LAB_0036c5fd;
    pMVar2 = Mio_LibraryReadOne(FileName,1,tExcludeGate,fVerbose);
    if (pMVar2 == (Mio_Library_t *)0x0) goto LAB_0036c5fa;
  }
  else {
    pMVar2 = Mio_LibraryReadBuffer(pBuffer,0,tExcludeGate,fVerbose_00);
    if (pMVar2 != (Mio_Library_t *)0x0) {
      pcVar3 = Extra_FileNameGenericAppend(FileName,".genlib");
      pcVar3 = Abc_UtilStrsav(pcVar3);
      pMVar2->pName = pcVar3;
      goto LAB_0036c5fd;
    }
    pMVar2 = Mio_LibraryReadBuffer(pBuffer_00,1,tExcludeGate,fVerbose_00);
    if (pMVar2 == (Mio_Library_t *)0x0) {
LAB_0036c5fa:
      pMVar2 = (Mio_Library_t *)0x0;
      goto LAB_0036c5fd;
    }
    pcVar3 = Extra_FileNameGenericAppend(FileName,".genlib");
    pcVar3 = Abc_UtilStrsav(pcVar3);
    pMVar2->pName = pcVar3;
  }
  puts("Warning: Read extended genlib format but ignoring extensions");
LAB_0036c5fd:
  free(pBuffer_00);
  if (tExcludeGate != (st__table *)0x0) {
    st__free_table(tExcludeGate);
  }
  return pMVar2;
}

Assistant:

Mio_Library_t * Mio_LibraryRead( char * FileName, char * pBuffer, char * ExcludeFile, int fVerbose )
{
    Mio_Library_t * pLib;
    int num;
    char * pBufferCopy;

    st__table * tExcludeGate = 0;

    if ( ExcludeFile )
    {
        tExcludeGate = st__init_table(strcmp, st__strhash);
        if ( (num = Mio_LibraryReadExclude( ExcludeFile, tExcludeGate )) == -1 )
        {
            st__free_table( tExcludeGate );
            tExcludeGate = 0;
            return 0;
        }
        fprintf ( stdout, "Read %d gates from exclude file\n", num );
    }

    pBufferCopy = Abc_UtilStrsav(pBuffer);
    if ( pBuffer == NULL )
        pLib = Mio_LibraryReadOne( FileName, 0, tExcludeGate, fVerbose );       // try normal format first ..
    else
    {
        pLib = Mio_LibraryReadBuffer( pBuffer, 0, tExcludeGate, fVerbose );       // try normal format first ..
        if ( pLib )
            pLib->pName = Abc_UtilStrsav( Extra_FileNameGenericAppend(FileName, ".genlib") );
    }
    if ( pLib == NULL )
    {
        if ( pBuffer == NULL )
            pLib = Mio_LibraryReadOne( FileName, 1, tExcludeGate, fVerbose );       // try normal format first ..
        else
        {
            pLib = Mio_LibraryReadBuffer( pBufferCopy, 1, tExcludeGate, fVerbose );       // try normal format first ..
            if ( pLib )
                pLib->pName = Abc_UtilStrsav( Extra_FileNameGenericAppend(FileName, ".genlib") );
        }
        if ( pLib != NULL )
            printf ( "Warning: Read extended genlib format but ignoring extensions\n" );
    }
    ABC_FREE( pBufferCopy );
    if ( tExcludeGate )
        st__free_table( tExcludeGate );

    return pLib;
}